

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O0

void UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  uint8_t uVar2;
  UChar UVar3;
  ushort uVar4;
  uint8_t *targetLimit_00;
  UChar *pUVar5;
  undefined4 uVar6;
  byte bVar7;
  UBool UVar8;
  uint uVar9;
  int32_t iVar10;
  int iVar11;
  UChar *pUVar12;
  uint8_t *puVar13;
  int *piVar14;
  int32_t local_a8;
  int32_t escLen_1;
  int32_t sourceIndex_1;
  int32_t sourceIndex;
  int32_t escLen;
  uint32_t uStack_94;
  int8_t cs0;
  int32_t len2;
  uint32_t value;
  int iStack_88;
  uint16_t csm;
  UChar trail;
  int8_t g;
  int8_t cs;
  int32_t i;
  int iStack_7c;
  UBool useFallback;
  uint32_t targetValue;
  int32_t choiceCount;
  int8_t choices [10];
  int32_t outLen;
  int32_t len;
  char buffer [8];
  UChar32 sourceChar;
  int32_t *offsets;
  UChar *sourceLimit;
  UChar *source;
  uint8_t *targetLimit;
  uint8_t *target;
  ISO2022State *pFromU2022State;
  UConverterDataISO2022 *converterData;
  UConverter *cnv;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  err_local = (UErrorCode *)args;
  cnv = (UConverter *)err;
  converterData = (UConverterDataISO2022 *)args->converter;
  targetLimit = (uint8_t *)args->target;
  targetLimit_00 = (uint8_t *)args->targetLimit;
  sourceLimit = args->source;
  pUVar5 = args->sourceLimit;
  stack0xffffffffffffffa8 = args->offsets;
  i = 0;
  pFromU2022State = (ISO2022State *)((UConverter *)converterData)->extraInfo;
  target = (uint8_t *)(((ISO2022State *)((UConverter *)converterData)->extraInfo)[0x10].cs + 2);
  iStack_7c = 0;
  buffer._0_4_ = ((UConverter *)converterData)->fromUChar32;
  if (buffer._0_4_ == 0) goto LAB_00422c1e;
  if (targetLimit_00 <= args->target) goto LAB_00422c1e;
  while( true ) {
    if (pUVar5 <= sourceLimit) {
      *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
      goto LAB_00423602;
    }
    value._0_2_ = *sourceLimit;
    if (((UChar)value & 0xfc00U) != 0xdc00) break;
    buffer._0_4_ = buffer._0_4_ * 0x400 + (uint)(ushort)(UChar)value + -0x35fdc00;
    *(undefined4 *)((long)&converterData->currentConverter + 4) = 0;
    sourceLimit = sourceLimit + 1;
    do {
      if (((int)buffer._0_4_ < 0x20) && ((1 << ((byte)buffer._0_4_ & 0x1f) & 0x800c000U) != 0)) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
        *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
        goto LAB_00423602;
      }
      if (iStack_7c == 0) {
        uVar4 = jpCharsetMasks[*(uint *)pFromU2022State[0x12].cs];
        iStack_7c = 0;
        if ((*(int *)pFromU2022State[0x12].cs == 3) || (*(int *)pFromU2022State[0x12].cs == 4)) {
          iStack_7c = 1;
          targetValue._2_1_ = 8;
        }
        bVar7 = *target;
        *(byte *)((long)&targetValue + (long)iStack_7c + 2) = bVar7;
        len2._2_2_ = uVar4 & 0xfeff & ((ushort)(1 << (bVar7 & 0x1f)) ^ 0xffff);
        bVar7 = target[2];
        iVar11 = iStack_7c + 1;
        if (bVar7 != 0) {
          *(byte *)((long)&targetValue + (long)(iStack_7c + 1) + 2) = bVar7;
          len2._2_2_ = len2._2_2_ & ((ushort)(1 << (bVar7 & 0x1f)) ^ 0xffff);
          iVar11 = iStack_7c + 2;
        }
        iStack_7c = iVar11;
        for (iStack_88 = 0; iStack_88 < 9; iStack_88 = iStack_88 + 1) {
          bVar7 = (byte)jpCharsetPref[iStack_88];
          if ((1 << (bVar7 & 0x1f) & (uint)len2._2_2_) != 0) {
            *(byte *)((long)&targetValue + (long)iStack_7c + 2) = bVar7;
            len2._2_2_ = len2._2_2_ & ((ushort)(1 << (bVar7 & 0x1f)) ^ 0xffff);
            iStack_7c = iStack_7c + 1;
          }
        }
      }
      value._2_1_ = '\0';
      value._3_1_ = '\0';
      choices[6] = '\0';
      choices[7] = '\0';
      choices[8] = '\0';
      choices[9] = '\0';
      cs = *(int8_t *)((long)converterData->myConverterArray + 0x3f);
      for (iStack_88 = 0; iStack_88 < iStack_7c && (int)choices._6_4_ < 1; iStack_88 = iStack_88 + 1
          ) {
        uVar2 = *(uint8_t *)((long)&targetValue + (long)iStack_88 + 2);
        switch(uVar2) {
        case '\0':
          if ((int)buffer._0_4_ < 0x80) {
            i._0_1_ = buffer[0];
            i._1_1_ = buffer[1];
            i._2_1_ = buffer[2];
            i._3_1_ = buffer[3];
            choices[6] = '\x01';
            choices[7] = '\0';
            choices[8] = '\0';
            choices[9] = '\0';
            value._2_1_ = '\0';
            value._3_1_ = uVar2;
          }
          break;
        case '\x01':
          if ((0x9f < (int)buffer._0_4_) && ((int)buffer._0_4_ < 0x100)) {
            i = buffer._0_4_ + -0x80;
            choices[6] = '\x01';
            choices[7] = '\0';
            choices[8] = '\0';
            choices[9] = '\0';
            value._2_1_ = '\x02';
            value._3_1_ = uVar2;
          }
          break;
        case '\x02':
          iVar10 = MBCS_SINGLE_FROM_UCHAR32
                             (*(UConverterSharedData **)
                               ((long)pFromU2022State + (long)(char)uVar2 * 8),buffer._0_4_,
                              &stack0xffffffffffffff6c,cs);
          if ((((iVar10 != 0) && ((-1 < iVar10 || (choices._6_4_ == 0)))) && (0x9f < uStack_94)) &&
             (uStack_94 < 0x100)) {
            i = uStack_94 - 0x80;
            choices[6] = (char)iVar10;
            choices[7] = (char)((uint)iVar10 >> 8);
            choices[8] = (char)((uint)iVar10 >> 0x10);
            choices[9] = (char)((uint)iVar10 >> 0x18);
            value._2_1_ = '\x02';
            cs = '\0';
            value._3_1_ = uVar2;
          }
          break;
        case '\x03':
          uStack_94 = jisx201FromU(buffer._0_4_);
          if (uStack_94 < 0x80) {
            choices[6] = '\x01';
            choices[7] = '\0';
            choices[8] = '\0';
            choices[9] = '\0';
            value._2_1_ = '\0';
            cs = '\0';
            value._3_1_ = uVar2;
            i = uStack_94;
          }
          break;
        case '\x04':
          iVar10 = MBCS_FROM_UCHAR32_ISO2022
                             (*(UConverterSharedData **)
                               ((long)pFromU2022State + (long)(char)uVar2 * 8),buffer._0_4_,
                              &stack0xffffffffffffff6c,cs,1);
          if ((iVar10 == 2) || ((iVar10 == -2 && (choices._6_4_ == 0)))) {
            uStack_94 = _2022FromSJIS(uStack_94);
            if (uStack_94 != 0) {
              choices[6] = (char)iVar10;
              choices[7] = (char)((uint)iVar10 >> 8);
              choices[8] = (char)((uint)iVar10 >> 0x10);
              choices[9] = (char)((uint)iVar10 >> 0x18);
              value._2_1_ = '\0';
              cs = '\0';
              value._3_1_ = uVar2;
              i = uStack_94;
            }
          }
          else if (((choices._6_4_ == 0) && (cs != '\0')) && (buffer._0_4_ - 0xff61 < 0x3f)) {
            i = (int32_t)hwkana_fb[buffer._0_4_ + -0xff61];
            choices[6] = -2;
            choices[7] = -1;
            choices[8] = -1;
            choices[9] = -1;
            value._2_1_ = '\0';
            cs = '\0';
            value._3_1_ = uVar2;
          }
          break;
        default:
          iVar10 = MBCS_FROM_UCHAR32_ISO2022
                             (*(UConverterSharedData **)
                               ((long)pFromU2022State + (long)(char)uVar2 * 8),buffer._0_4_,
                              &stack0xffffffffffffff6c,cs,1);
          if (((iVar10 == 2) || ((iVar10 == -2 && (choices._6_4_ == 0)))) &&
             ((uVar2 != '\a' || (uStack_94 = _2022FromGR94DBCS(uStack_94), uStack_94 != 0)))) {
            i = uStack_94;
            choices[6] = (char)iVar10;
            choices[7] = (char)((uint)iVar10 >> 8);
            choices[8] = (char)((uint)iVar10 >> 0x10);
            choices[9] = (char)((uint)iVar10 >> 0x18);
            value._2_1_ = '\0';
            cs = '\0';
            value._3_1_ = uVar2;
          }
          break;
        case '\b':
          if (buffer._0_4_ - 0xff61 < 0x3f) {
            if (*(int *)pFromU2022State[0x12].cs == 3) {
              i = buffer._0_4_ + -0xff40;
              choices[6] = '\x01';
              choices[7] = '\0';
              choices[8] = '\0';
              choices[9] = '\0';
              target[1] = uVar2;
              value._2_1_ = '\x01';
              value._3_1_ = uVar2;
            }
            else if (*(int *)pFromU2022State[0x12].cs == 4) {
              i = buffer._0_4_ + -0xfec0;
              choices[6] = '\x01';
              choices[7] = '\0';
              choices[8] = '\0';
              choices[9] = '\0';
              value._3_1_ = *target;
              if (('\x03' < (char)value._3_1_) && ((char)value._3_1_ < '\b')) {
                value._3_1_ = '\x03';
              }
              value._2_1_ = '\0';
            }
          }
        }
      }
      if (choices._6_4_ == 0) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 10;
        *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
        goto LAB_00423602;
      }
      if ((int)choices._6_4_ < 0) {
        choices._6_4_ = -choices._6_4_;
      }
      choices[2] = '\0';
      choices[3] = '\0';
      choices[4] = '\0';
      choices[5] = '\0';
      if ((target[4] == '\x01') && (value._2_1_ == '\0')) {
        choices[2] = '\x01';
        choices[3] = '\0';
        choices[4] = '\0';
        choices[5] = '\0';
        outLen._0_1_ = '\x0f';
        target[4] = '\0';
      }
      if (value._3_1_ != target[(char)value._2_1_]) {
        cVar1 = "\x03\x03\x03\x03\x03\x04\x03\x04\x03"[(char)value._3_1_];
        memcpy((void *)((long)&outLen + (long)(int)choices._2_4_),escSeqChars + (char)value._3_1_,
               (long)(int)cVar1);
        choices._2_4_ = (int)cVar1 + choices._2_4_;
        target[(char)value._2_1_] = value._3_1_;
        iStack_7c = 0;
      }
      if (value._2_1_ != target[4]) {
        if (value._2_1_ == '\x01') {
          *(undefined1 *)((long)&outLen + (long)(int)choices._2_4_) = 0xe;
          target[4] = '\x01';
          choices._2_4_ = choices._2_4_ + 1;
        }
        else {
          iVar11 = choices._2_4_ + 1;
          *(undefined1 *)((long)&outLen + (long)(int)choices._2_4_) = 0x1b;
          choices._2_4_ = choices._2_4_ + 2;
          *(undefined1 *)((long)&outLen + (long)iVar11) = 0x4e;
        }
      }
      uVar6 = choices._2_4_;
      if (choices._6_4_ == 1) {
        choices._2_4_ = choices._2_4_ + 1;
        *(char *)((long)&outLen + (long)(int)uVar6) = (char)i;
      }
      else {
        iVar11 = choices._2_4_ + 1;
        *(char *)((long)&outLen + (long)(int)choices._2_4_) = (char)((uint)i >> 8);
        choices._2_4_ = choices._2_4_ + 2;
        *(char *)((long)&outLen + (long)iVar11) = (char)i;
      }
      puVar13 = targetLimit;
      piVar14 = stack0xffffffffffffffa8;
      if ((buffer._0_4_ == 0xd) || (buffer._0_4_ == 10)) {
        target[2] = '\0';
        iStack_7c = 0;
      }
      if (choices._2_4_ == 1) {
        targetLimit = targetLimit + 1;
        *puVar13 = (uint8_t)outLen;
        if (stack0xffffffffffffffa8 != (int *)0x0) {
          stack0xffffffffffffffa8 = stack0xffffffffffffffa8 + 1;
          *piVar14 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) + -1;
        }
      }
      else if ((choices._2_4_ == 2) && (targetLimit + 2 <= targetLimit_00)) {
        puVar13 = targetLimit + 1;
        *targetLimit = (uint8_t)outLen;
        targetLimit = targetLimit + 2;
        *puVar13 = outLen._1_1_;
        if (stack0xffffffffffffffa8 != (int *)0x0) {
          iVar11 = 2;
          if ((uint)buffer._0_4_ < 0x10000) {
            iVar11 = 1;
          }
          iVar11 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) - iVar11;
          piVar14 = stack0xffffffffffffffa8 + 1;
          *stack0xffffffffffffffa8 = iVar11;
          stack0xffffffffffffffa8 = stack0xffffffffffffffa8 + 2;
          *piVar14 = iVar11;
        }
      }
      else {
        iVar11 = 2;
        if ((uint)buffer._0_4_ < 0x10000) {
          iVar11 = 1;
        }
        fromUWriteUInt8((UConverter *)converterData,(char *)&outLen,choices._2_4_,&targetLimit,
                        (char *)targetLimit_00,(int32_t **)(buffer + 4),
                        (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) - iVar11,
                        (UErrorCode *)cnv);
        UVar8 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
        if (UVar8 != '\0') goto LAB_00423602;
      }
LAB_00422c1e:
      if (pUVar5 <= sourceLimit) goto LAB_00423602;
      if (targetLimit_00 <= targetLimit) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
        goto LAB_00423602;
      }
      pUVar12 = sourceLimit + 1;
      UVar3 = *sourceLimit;
      uVar9 = (uint)(ushort)UVar3;
      buffer[0] = (char)uVar9;
      buffer[1] = (char)(uVar9 >> 8);
      buffer[2] = (char)(uVar9 >> 0x10);
      buffer[3] = (char)(uVar9 >> 0x18);
      sourceLimit = pUVar12;
    } while ((uVar9 & 0xfffff800) != 0xd800);
    if ((UVar3 & 0x400U) != 0) {
      *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
      *(uint *)((long)&converterData->currentConverter + 4) = uVar9;
LAB_00423602:
      UVar8 = U_SUCCESS(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      if ((UVar8 != '\0') &&
         ((((target[4] != '\0' || (*target != '\0')) && (*(byte *)((long)err_local + 2) != 0)) &&
          ((pUVar5 <= sourceLimit && (*(int *)((long)&converterData->currentConverter + 4) == 0)))))
         ) {
        uVar2 = target[4];
        if (uVar2 != '\0') {
          target[4] = '\0';
        }
        choices[3] = '\0';
        choices[4] = '\0';
        choices[5] = '\0';
        choices[2] = uVar2 != '\0';
        if (*target != '\0') {
          memcpy((void *)((long)&outLen + (long)(int)choices._2_4_),escSeqChars,3);
          choices._2_4_ = choices._2_4_ + 3;
          *target = '\0';
        }
        iVar11 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1);
        if (iVar11 < 1) {
          local_a8 = -1;
        }
        else {
          local_a8 = iVar11 + -1;
          if (((*(ushort *)(*(undefined8 *)(err_local + 4) + (long)local_a8 * 2) & 0xfc00) == 0xdc00
              ) && ((local_a8 == 0 ||
                    ((*(ushort *)(*(undefined8 *)(err_local + 4) + (long)(iVar11 + -2) * 2) & 0xfc00
                     ) == 0xd800)))) {
            local_a8 = iVar11 + -2;
          }
        }
        fromUWriteUInt8((UConverter *)converterData,(char *)&outLen,choices._2_4_,&targetLimit,
                        (char *)targetLimit_00,(int32_t **)(buffer + 4),local_a8,(UErrorCode *)cnv);
      }
      *(UChar **)(err_local + 4) = sourceLimit;
      *(uint8_t **)(err_local + 8) = targetLimit;
      return;
    }
  }
  *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
  *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
  goto LAB_00423602;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err) {
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len, outLen;
    int8_t choices[10];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    int32_t i;
    int8_t cs, g;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while(source < sourceLimit) {
        if(target < targetLimit) {

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
            if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            /* do the conversion */

            if(choiceCount == 0) {
                uint16_t csm;

                /*
                 * The csm variable keeps track of which charsets are allowed
                 * and not used yet while building the choices[].
                 */
                csm = jpCharsetMasks[converterData->version];
                choiceCount = 0;

                /* JIS7/8: try single-byte half-width Katakana before JISX208 */
                if(converterData->version == 3 || converterData->version == 4) {
                    choices[choiceCount++] = (int8_t)HWKANA_7BIT;
                }
                /* Do not try single-byte half-width Katakana for other versions. */
                csm &= ~CSM(HWKANA_7BIT);

                /* try the current G0 charset */
                choices[choiceCount++] = cs = pFromU2022State->cs[0];
                csm &= ~CSM(cs);

                /* try the current G2 charset */
                if((cs = pFromU2022State->cs[2]) != 0) {
                    choices[choiceCount++] = cs;
                    csm &= ~CSM(cs);
                }

                /* try all the other possible charsets */
                for(i = 0; i < UPRV_LENGTHOF(jpCharsetPref); ++i) {
                    cs = (int8_t)jpCharsetPref[i];
                    if(CSM(cs) & csm) {
                        choices[choiceCount++] = cs;
                        csm &= ~CSM(cs);
                    }
                }
            }

            cs = g = 0;
            /*
             * len==0: no mapping found yet
             * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
             * len>0: found a roundtrip result, done
             */
            len = 0;
            /*
             * We will turn off useFallback after finding a fallback,
             * but we still get fallbacks from PUA code points as usual.
             * Therefore, we will also need to check that we don't overwrite
             * an early fallback with a later one.
             */
            useFallback = cnv->useFallback;

            for(i = 0; i < choiceCount && len <= 0; ++i) {
                uint32_t value;
                int32_t len2;
                int8_t cs0 = choices[i];
                switch(cs0) {
                case ASCII:
                    if(sourceChar <= 0x7f) {
                        targetValue = (uint32_t)sourceChar;
                        len = 1;
                        cs = cs0;
                        g = 0;
                    }
                    break;
                case ISO8859_1:
                    if(GR96_START <= sourceChar && sourceChar <= GR96_END) {
                        targetValue = (uint32_t)sourceChar - 0x80;
                        len = 1;
                        cs = cs0;
                        g = 2;
                    }
                    break;
                case HWKANA_7BIT:
                    if((uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        if(converterData->version==3) {
                            /* JIS7: use G1 (SO) */
                            /* Shift U+FF61..U+FF9F to bytes 21..5F. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0x21));
                            len = 1;
                            pFromU2022State->cs[1] = cs = cs0; /* do not output an escape sequence */
                            g = 1;
                        } else if(converterData->version==4) {
                            /* JIS8: use 8-bit bytes with any single-byte charset, see escape sequence output below */
                            /* Shift U+FF61..U+FF9F to bytes A1..DF. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0xa1));
                            len = 1;

                            cs = pFromU2022State->cs[0];
                            if(IS_JP_DBCS(cs)) {
                                /* switch from a DBCS charset to JISX201 */
                                cs = (int8_t)JISX201;
                            }
                            /* else stay in the current G0 charset */
                            g = 0;
                        }
                        /* else do not use HWKANA_7BIT with other versions */
                    }
                    break;
                case JISX201:
                    /* G0 SBCS */
                    value = jisx201FromU(sourceChar);
                    if(value <= 0x7f) {
                        targetValue = value;
                        len = 1;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case JISX208:
                    /* G0 DBCS from Shift-JIS table */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        value = _2022FromSJIS(value);
                        if(value != 0) {
                            targetValue = value;
                            len = len2;
                            cs = cs0;
                            g = 0;
                            useFallback = FALSE;
                        }
                    } else if(len == 0 && useFallback &&
                              (uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        targetValue = hwkana_fb[sourceChar - HWKANA_START];
                        len = -2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case ISO8859_7:
                    /* G0 SBCS forced to 7-bit output */
                    len2 = MBCS_SINGLE_FROM_UCHAR32(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback);
                    if(len2 != 0 && !(len2 < 0 && len != 0) && GR96_START <= value && value <= GR96_END) {
                        targetValue = value - 0x80;
                        len = len2;
                        cs = cs0;
                        g = 2;
                        useFallback = FALSE;
                    }
                    break;
                default:
                    /* G0 DBCS */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        if(cs0 == KSC5601) {
                            /*
                             * Check for valid bytes for the encoding scheme.
                             * This is necessary because the sub-converter (windows-949)
                             * has a broader encoding scheme than is valid for 2022.
                             */
                            value = _2022FromGR94DBCS(value);
                            if(value == 0) {
                                break;
                            }
                        }
                        targetValue = value;
                        len = len2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                }
            }

            if(len != 0) {
                if(len < 0) {
                    len = -len;  /* fallback */
                }
                outLen = 0; /* count output bytes */

                /* write SI if necessary (only for JIS7) */
                if(pFromU2022State->g == 1 && g == 0) {
                    buffer[outLen++] = UCNV_SI;
                    pFromU2022State->g = 0;
                }

                /* write the designation sequence if necessary */
                if(cs != pFromU2022State->cs[g]) {
                    int32_t escLen = escSeqCharsLen[cs];
                    uprv_memcpy(buffer + outLen, escSeqChars[cs], escLen);
                    outLen += escLen;
                    pFromU2022State->cs[g] = cs;

                    /* invalidate the choices[] */
                    choiceCount = 0;
                }

                /* write the shift sequence if necessary */
                if(g != pFromU2022State->g) {
                    switch(g) {
                    /* case 0 handled before writing escapes */
                    case 1:
                        buffer[outLen++] = UCNV_SO;
                        pFromU2022State->g = 1;
                        break;
                    default: /* case 2 */
                        buffer[outLen++] = 0x1b;
                        buffer[outLen++] = 0x4e;
                        break;
                    /* no case 3: no SS3 in ISO-2022-JP-x */
                    }
                }

                /* write the output bytes */
                if(len == 1) {
                    buffer[outLen++] = (char)targetValue;
                } else /* len == 2 */ {
                    buffer[outLen++] = (char)(targetValue >> 8);
                    buffer[outLen++] = (char)targetValue;
                }
            } else {
                /*
                 * if we cannot find the character after checking all codepages
                 * then this is an error
                 */
                *err = U_INVALID_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            if(sourceChar == CR || sourceChar == LF) {
                /* reset the G2 state at the end of a line (conversion got us into ASCII or JISX201 already) */
                pFromU2022State->cs[2] = 0;
                choiceCount = 0;
            }

            /* output outLen>0 bytes in buffer[] */
            if(outLen == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(outLen == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, outLen,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-JP conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   in SO mode or not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        (pFromU2022State->g!=0 || pFromU2022State->cs[0]!=ASCII) &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        outLen = 0;

        if(pFromU2022State->g != 0) {
            buffer[outLen++] = UCNV_SI;
            pFromU2022State->g = 0;
        }

        if(pFromU2022State->cs[0] != ASCII) {
            int32_t escLen = escSeqCharsLen[ASCII];
            uprv_memcpy(buffer + outLen, escSeqChars[ASCII], escLen);
            outLen += escLen;
            pFromU2022State->cs[0] = (int8_t)ASCII;
        }

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            buffer, outLen,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}